

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Led.cpp
# Opt level: O3

void __thiscall tiles::Led::cloneTo(Led *this,Chunk *chunk,uint tileIndex,Tile target)

{
  TileData TVar1;
  uint uVar2;
  Chunk *this_00;
  
  this_00 = Tile::getChunk(&target);
  uVar2 = Tile::getIndex(&target);
  TVar1 = chunk->tiles_[tileIndex];
  Chunk::markTileDirty(this_00,uVar2);
  this_00->tiles_[uVar2] =
       (TileData)(((uint)this_00->tiles_[uVar2] & 0xc0e0) + ((uint)TVar1 & 0x300) + 8);
  return;
}

Assistant:

void Led::cloneTo(const Chunk& chunk, unsigned int tileIndex, Tile target) {
    const auto& tileData = getTileData(chunk, tileIndex);
    init(target.getChunk(), target.getIndex(), tileData.state1);
}